

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall
Clone_unitsImportedUnits_Test::Clone_unitsImportedUnits_Test(Clone_unitsImportedUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_00116d48;
  return;
}

Assistant:

TEST(Clone, unitsImportedUnits)
{
    auto u = libcellml::Units::create();
    auto import = libcellml::ImportSource::create();
    import->setUrl("some-other-model.xml");

    u->setId("unique_id");
    u->setName("units");
    u->setSourceUnits(import, "imported_units_name");

    auto uClone = u->clone();

    compareUnits(u, uClone);

    auto model = libcellml::Model::create();
    auto printer = libcellml::Printer::create();
    model->addUnits(u);
    EXPECT_EQ(printer->printModel(model), printer->printModel(model->clone()));
}